

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  uchar *inputbuff;
  Curl_easy *data_00;
  CURLcode CVar1;
  CURLMcode CVar2;
  size_t sVar3;
  char *pcVar4;
  timediff_t tVar5;
  undefined8 uVar6;
  ulong uVar7;
  uchar *puVar8;
  char *b64;
  size_t b64len;
  Curl_easy *local_60;
  char *local_58;
  Curl_easy *local_50;
  char *local_48;
  CURLM *local_40;
  size_t local_38;
  
  local_60 = (Curl_easy *)0x0;
  sVar3 = strlen(host);
  uVar6 = 4;
  if (sVar3 - 0x1f1 < 0xfffffffffffffdff) {
LAB_0014182c:
    Curl_failf(data,"Failed to encode DOH packet [%d]\n",uVar6);
    return CURLE_OUT_OF_MEMORY;
  }
  p->dohbuffer[0] = '\0';
  p->dohbuffer[1] = '\0';
  p->dohbuffer[2] = '\x01';
  p->dohbuffer[3] = '\0';
  p->dohbuffer[4] = '\0';
  p->dohbuffer[5] = '\x01';
  puVar8 = p->dohbuffer + 0xc;
  p->dohbuffer[6] = '\0';
  p->dohbuffer[7] = '\0';
  p->dohbuffer[8] = '\0';
  p->dohbuffer[9] = '\0';
  p->dohbuffer[10] = '\0';
  p->dohbuffer[0xb] = '\0';
  local_50 = data;
  local_40 = multi;
  pcVar4 = strchr(host,0x2e);
  while (pcVar4 != (char *)0x0) {
    uVar7 = (long)pcVar4 - (long)host;
    if (0x3f < uVar7) goto LAB_00141816;
    *puVar8 = (uchar)uVar7;
    memcpy(puVar8 + 1,host,uVar7);
    puVar8 = puVar8 + uVar7 + 1;
    host = host + uVar7 + 1;
    pcVar4 = strchr(host,0x2e);
  }
  sVar3 = strlen(host);
  if (0x3f < sVar3) {
LAB_00141816:
    p->dohlen = 0;
    uVar6 = 1;
    data = local_50;
    goto LAB_0014182c;
  }
  inputbuff = p->dohbuffer;
  *puVar8 = (uchar)sVar3;
  memcpy(puVar8 + 1,host,sVar3);
  data_00 = local_50;
  (puVar8 + sVar3 + 1)[0] = '\0';
  (puVar8 + sVar3 + 1)[1] = '\0';
  puVar8[sVar3 + 3] = (uchar)dnstype;
  (puVar8 + sVar3 + 4)[0] = '\0';
  (puVar8 + sVar3 + 4)[1] = '\x01';
  p->dohlen = (size_t)(puVar8 + (sVar3 - (long)inputbuff) + 6);
  p->dnstype = dnstype;
  (p->serverdoh).memory = (uchar *)0x0;
  (p->serverdoh).size = 0;
  if (((local_50->set).field_0x88f & 1) == 0) {
    local_58 = (char *)0x0;
    pcVar4 = local_58;
LAB_001418c8:
    local_58 = pcVar4;
    tVar5 = Curl_timeleft(data_00,(curltime *)0x0,true);
    CVar1 = Curl_open(&local_60);
    pcVar4 = local_58;
    if ((((((CVar1 == CURLE_OK) &&
           (CVar1 = curl_easy_setopt(local_60,CURLOPT_URL,url), pcVar4 = local_58, CVar1 == CURLE_OK
           )) && (CVar1 = curl_easy_setopt(local_60,CURLOPT_WRITEFUNCTION,doh_write_cb),
                 pcVar4 = local_58, CVar1 == CURLE_OK)) &&
         (CVar1 = curl_easy_setopt(local_60,CURLOPT_WRITEDATA,&p->serverdoh), pcVar4 = local_58,
         CVar1 == CURLE_OK)) &&
        (((*(ulong *)&(data_00->set).field_0x888 & 0x100000000000000) != 0 ||
         ((CVar1 = curl_easy_setopt(local_60,CURLOPT_POSTFIELDS,inputbuff), CVar1 == CURLE_OK &&
          (CVar1 = curl_easy_setopt(local_60,CURLOPT_POSTFIELDSIZE,p->dohlen), CVar1 == CURLE_OK))))
        )) && ((CVar1 = curl_easy_setopt(local_60,CURLOPT_HTTPHEADER,headers), CVar1 == CURLE_OK &&
               ((CVar1 = curl_easy_setopt(local_60,CURLOPT_PROTOCOLS,2), CVar1 == CURLE_OK &&
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_TIMEOUT_MS,tVar5), CVar1 == CURLE_OK)))))
       ) {
      uVar7 = *(ulong *)&(data_00->set).field_0x888;
      if (((uint)uVar7 >> 0x1e & 1) != 0) {
        CVar1 = curl_easy_setopt(local_60,CURLOPT_VERBOSE,1);
        pcVar4 = local_58;
        if (CVar1 != CURLE_OK) goto LAB_0014195f;
        uVar7 = *(ulong *)&(local_50->set).field_0x888;
      }
      if ((((((((((uVar7 >> 0x22 & 1) == 0) ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_NOSIGNAL,1), pcVar4 = local_58,
                CVar1 == CURLE_OK)) &&
               ((((local_50->set).ssl.field_0xa0 & 2) == 0 ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_FALSESTART,1), pcVar4 = local_58,
                CVar1 == CURLE_OK)))) &&
              (((((local_50->set).ssl.primary.field_0x48 & 2) == 0 ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYHOST,2), pcVar4 = local_58,
                CVar1 == CURLE_OK)) &&
               ((((local_50->set).proxy_ssl.primary.field_0x48 & 2) == 0 ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_PROXY_SSL_VERIFYHOST,2),
                pcVar4 = local_58, CVar1 == CURLE_OK)))))) &&
             ((((((local_50->set).ssl.primary.field_0x48 & 1) == 0 ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYPEER,1), pcVar4 = local_58,
                CVar1 == CURLE_OK)) &&
               ((((local_50->set).proxy_ssl.primary.field_0x48 & 1) == 0 ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_PROXY_SSL_VERIFYPEER,1),
                pcVar4 = local_58, CVar1 == CURLE_OK)))) &&
              ((((local_50->set).ssl.primary.field_0x48 & 4) == 0 ||
               (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYSTATUS,1), pcVar4 = local_58,
               CVar1 == CURLE_OK)))))) &&
            (((local_50->set).str[0x1c] == (char *)0x0 ||
             (CVar1 = curl_easy_setopt(local_60,CURLOPT_CAINFO), pcVar4 = local_58,
             CVar1 == CURLE_OK)))) &&
           (((((local_50->set).str[0x1d] == (char *)0x0 ||
              (CVar1 = curl_easy_setopt(local_60,CURLOPT_PROXY_CAINFO), pcVar4 = local_58,
              CVar1 == CURLE_OK)) &&
             (((local_50->set).str[0x1a] == (char *)0x0 ||
              (CVar1 = curl_easy_setopt(local_60,CURLOPT_CAPATH), pcVar4 = local_58,
              CVar1 == CURLE_OK)))) &&
            ((((local_50->set).str[0x1b] == (char *)0x0 ||
              (CVar1 = curl_easy_setopt(local_60,CURLOPT_PROXY_CAPATH), pcVar4 = local_58,
              CVar1 == CURLE_OK)) &&
             ((((local_50->set).str[0x27] == (char *)0x0 ||
               (CVar1 = curl_easy_setopt(local_60,CURLOPT_CRLFILE), pcVar4 = local_58,
               CVar1 == CURLE_OK)) &&
              (((((local_50->set).str[0x28] == (char *)0x0 ||
                 (CVar1 = curl_easy_setopt(local_60,CURLOPT_PROXY_CRLFILE), pcVar4 = local_58,
                 CVar1 == CURLE_OK)) &&
                ((((local_50->set).ssl.field_0xa0 & 1) == 0 ||
                 (CVar1 = curl_easy_setopt(local_60,CURLOPT_CERTINFO,1), pcVar4 = local_58,
                 CVar1 == CURLE_OK)))) &&
               (((local_50->set).str[0x25] == (char *)0x0 ||
                (CVar1 = curl_easy_setopt(local_60,CURLOPT_RANDOM_FILE), pcVar4 = local_58,
                CVar1 == CURLE_OK)))))))))))) &&
          (((local_50->set).str[0x24] == (char *)0x0 ||
           (CVar1 = curl_easy_setopt(local_60,CURLOPT_EGDSOCKET), pcVar4 = local_58,
           CVar1 == CURLE_OK)))) &&
         (((((((local_50->set).ssl.field_0xa0 & 8) == 0 ||
             (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_OPTIONS,2), pcVar4 = local_58,
             CVar1 == CURLE_OK)) &&
            ((((local_50->set).proxy_ssl.field_0xa0 & 8) == 0 ||
             (CVar1 = curl_easy_setopt(local_60,CURLOPT_PROXY_SSL_OPTIONS,2), pcVar4 = local_58,
             CVar1 == CURLE_OK)))) &&
           (((local_50->set).ssl.fsslctx == (curl_ssl_ctx_callback)0x0 ||
            (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_CTX_FUNCTION), pcVar4 = local_58,
            CVar1 == CURLE_OK)))) &&
          (((local_50->set).ssl.fsslctxp == (void *)0x0 ||
           (CVar1 = curl_easy_setopt(local_60,CURLOPT_SSL_CTX_DATA), pcVar4 = local_58,
           CVar1 == CURLE_OK)))))) {
        (local_60->set).fmultidone = Curl_doh_done;
        (local_60->set).dohfor = local_50;
        p->easy = local_60;
        CVar2 = curl_multi_add_handle(local_40,local_60);
        CVar1 = CURLE_OK;
        pcVar4 = local_58;
        if (CVar2 == CURLM_OK) {
          (*Curl_cfree)(local_58);
          return CURLE_OK;
        }
      }
    }
  }
  else {
    CVar1 = Curl_base64url_encode
                      (local_50,(char *)inputbuff,(size_t)(puVar8 + (sVar3 - (long)inputbuff) + 6),
                       &local_48,&local_38);
    if (CVar1 == CURLE_OK) {
      url = curl_maprintf("%s?dns=%s",url,local_48);
      (*Curl_cfree)(local_48);
      pcVar4 = url;
      if (url != (char *)0x0) goto LAB_001418c8;
      CVar1 = CURLE_OUT_OF_MEMORY;
    }
    pcVar4 = (char *)0x0;
  }
LAB_0014195f:
  (*Curl_cfree)(pcVar4);
  Curl_close(local_60);
  return CVar1;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  char *nurl = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DOH packet [%d]\n", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  p->serverdoh.memory = NULL;
  /* the memory will be grown as needed by realloc in the doh_write_cb
     function */
  p->serverdoh.size = 0;

  /* Note: this is code for sending the DoH request with GET but there's still
     no logic that actually enables this. We should either add that ability or
     yank out the GET code. Discuss! */
  if(data->set.doh_get) {
    char *b64;
    size_t b64len;
    result = Curl_base64url_encode(data, (char *)p->dohbuffer, p->dohlen,
                                   &b64, &b64len);
    if(result)
      goto error;
    nurl = aprintf("%s?dns=%s", url, b64);
    free(b64);
    if(!nurl) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }
    url = nurl;
  }

  timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dohresponse *resp = &p->serverdoh;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    if(!data->set.doh_get) {
      ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
      ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    }
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_NGHTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661 */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.ssl.primary.verifyhost)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST, 2L);
    if(data->set.proxy_ssl.primary.verifyhost)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_VERIFYHOST, 2L);
    if(data->set.ssl.primary.verifypeer)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER, 1L);
    if(data->set.proxy_ssl.primary.verifypeer)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_VERIFYPEER, 1L);
    if(data->set.ssl.primary.verifystatus)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS, 1L);
    if(data->set.str[STRING_SSL_CAFILE_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
        data->set.str[STRING_SSL_CAFILE_ORIG]);
    }
    if(data->set.str[STRING_SSL_CAFILE_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CAINFO,
        data->set.str[STRING_SSL_CAFILE_PROXY]);
    }
    if(data->set.str[STRING_SSL_CAPATH_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
        data->set.str[STRING_SSL_CAPATH_ORIG]);
    }
    if(data->set.str[STRING_SSL_CAPATH_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CAPATH,
        data->set.str[STRING_SSL_CAPATH_PROXY]);
    }
    if(data->set.str[STRING_SSL_CRLFILE_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
        data->set.str[STRING_SSL_CRLFILE_ORIG]);
    }
    if(data->set.str[STRING_SSL_CRLFILE_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CRLFILE,
        data->set.str[STRING_SSL_CRLFILE_PROXY]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.str[STRING_SSL_RANDOM_FILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_RANDOM_FILE,
        data->set.str[STRING_SSL_RANDOM_FILE]);
    }
    if(data->set.str[STRING_SSL_EGDSOCKET]) {
      ERROR_CHECK_SETOPT(CURLOPT_EGDSOCKET,
        data->set.str[STRING_SSL_EGDSOCKET]);
    }
    if(data->set.ssl.no_revoke)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
    if(data->set.proxy_ssl.no_revoke)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);

    doh->set.fmultidone = Curl_doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* add this transfer to the multi handle */
    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  free(nurl);
  return CURLE_OK;

  error:
  free(nurl);
  Curl_close(doh);
  return result;
}